

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall Assimp::ObjFileParser::getFace(ObjFileParser *this,aiPrimitiveType type)

{
  uint *puVar1;
  Face *pFVar2;
  byte bVar3;
  int iVar4;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var5;
  Logger *pLVar6;
  Model *pMVar7;
  DeadlyImportError *this_00;
  long lVar8;
  Material *pMVar9;
  IndexArray *pIVar10;
  Mesh *pMVar11;
  ulong uVar12;
  byte *pbVar13;
  int iVar14;
  int iVar15;
  allocator local_a9;
  aiPrimitiveType local_a8;
  int local_a4;
  string local_a0;
  IndexArray *local_80;
  IndexArray *local_78;
  IndexArray *local_70;
  Face *local_68;
  long local_60;
  long local_58;
  long local_50;
  pointer local_48;
  pointer local_40;
  Face *face;
  
  local_a8 = type;
  _Var5 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var5._M_current;
  pbVar13 = (byte *)(this->m_DataItEnd)._M_current;
  if (((byte *)_Var5._M_current != pbVar13) && (*_Var5._M_current != '\0')) {
    local_68 = (Face *)operator_new(0x58);
    local_68->m_PrimitiveType = local_a8;
    local_70 = &local_68->m_vertices;
    (local_68->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_68->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_68->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_68->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_68->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_68->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_68->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_68->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_68->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68->m_pMaterial = (Material *)0x0;
    pMVar7 = (this->m_pModel)._M_t.
             super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
             .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
    local_50 = ((long)*(pointer *)
                       ((long)&(pMVar7->m_Vertices).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                       + 8) -
               *(long *)&(pMVar7->m_Vertices).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl) / 0xc;
    local_40 = *(pointer *)
                ((long)&(pMVar7->m_TextureCoord).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> +
                8);
    local_48 = *(pointer *)
                &(pMVar7->m_TextureCoord).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl;
    local_58 = ((long)local_40 - (long)local_48) / 0xc;
    lVar8 = (long)*(pointer *)
                   ((long)&(pMVar7->m_Normals).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                   + 8) -
            *(long *)&(pMVar7->m_Normals).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl;
    local_60 = lVar8 / 0xc;
    local_a4 = (lVar8 != 0) + 1;
    local_78 = &local_68->m_normals;
    local_80 = &local_68->m_texturCoords;
    bVar3 = 0;
    iVar14 = 0;
    face = local_68;
    while (pFVar2 = local_68, (byte *)_Var5._M_current != pbVar13) {
      uVar12 = (ulong)(byte)*_Var5._M_current;
      if (uVar12 < 0x30) {
        iVar15 = 0;
        if ((0x100000200U >> (uVar12 & 0x3f) & 1) == 0) {
          if (uVar12 != 0x2f) {
            if ((0x3401UL >> (uVar12 & 0x3f) & 1) == 0) goto LAB_00434133;
            break;
          }
          if (local_a8 == aiPrimitiveType_POINT) {
            pLVar6 = DefaultLogger::get();
            Logger::error(pLVar6,"Obj: Separator unexpected in point statement");
          }
          iVar15 = iVar14 + 1;
        }
        uVar12 = 1;
      }
      else {
LAB_00434133:
        iVar4 = atoi(_Var5._M_current);
        pFVar2 = local_68;
        uVar12 = (ulong)(1 - (iVar4 >> 0x1f));
        for (iVar15 = iVar4; 0x12 < iVar15 + 9U; iVar15 = iVar15 / 10) {
          uVar12 = uVar12 + 1;
        }
        iVar15 = local_a4;
        if (iVar14 != 1) {
          iVar15 = iVar14;
        }
        if (local_48 != local_40) {
          iVar15 = iVar14;
        }
        pIVar10 = local_80;
        if (iVar4 < 1) {
          if (-1 < iVar4) {
            ObjFile::Face::~Face(local_68);
            operator_delete(pFVar2);
            this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string((string *)&local_a0,"OBJ: Invalid face indice",&local_a9);
            DeadlyImportError::DeadlyImportError(this_00,&local_a0);
            __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (iVar15 == 2) {
            local_a0._M_dataplus._M_p._0_4_ = iVar4 + (int)local_60;
            goto LAB_004341e0;
          }
          if (iVar15 == 1) {
            local_a0._M_dataplus._M_p._0_4_ = iVar4 + (int)local_58;
          }
          else {
            if (iVar15 != 0) goto LAB_004341b1;
            local_a0._M_dataplus._M_p._0_4_ = iVar4 + (int)local_50;
            pIVar10 = local_70;
          }
        }
        else {
          if (iVar15 == 2) {
            local_a0._M_dataplus._M_p._0_4_ = iVar4 + -1;
LAB_004341e0:
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (local_78,(uint *)&local_a0);
            bVar3 = 1;
            goto LAB_00434206;
          }
          if (iVar15 == 1) {
            local_a0._M_dataplus._M_p._0_4_ = iVar4 + -1;
          }
          else {
            if (iVar15 != 0) {
LAB_004341b1:
              reportErrorTokenInFace(this);
              goto LAB_00434206;
            }
            local_a0._M_dataplus._M_p._0_4_ = iVar4 + -1;
            pIVar10 = local_70;
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (pIVar10,(uint *)&local_a0);
      }
LAB_00434206:
      _Var5._M_current = (this->m_DataIt)._M_current + uVar12;
      (this->m_DataIt)._M_current = _Var5._M_current;
      iVar14 = iVar15;
      pbVar13 = (byte *)(this->m_DataItEnd)._M_current;
    }
    if ((local_68->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (local_68->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pLVar6 = DefaultLogger::get();
      Logger::error(pLVar6,"Obj: Ignoring empty face");
      _Var5 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine)
      ;
      (this->m_DataIt)._M_current = _Var5._M_current;
      ObjFile::Face::~Face(pFVar2);
      operator_delete(pFVar2);
    }
    else {
      pMVar7 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      pMVar9 = pMVar7->m_pCurrentMaterial;
      if (pMVar9 == (Material *)0x0) {
        pMVar9 = pMVar7->m_pDefaultMaterial;
      }
      local_68->m_pMaterial = pMVar9;
      if (pMVar7->m_pCurrent == (Object *)0x0) {
        createObject(this,(string *)DefaultObjName_abi_cxx11_);
        pMVar7 = (this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      }
      pMVar11 = pMVar7->m_pCurrentMesh;
      if (pMVar11 == (Mesh *)0x0) {
        createMesh(this,(string *)DefaultObjName_abi_cxx11_);
        pMVar11 = ((this->m_pModel)._M_t.
                   super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                   .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                  m_pCurrentMesh;
      }
      std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::push_back
                (&pMVar11->m_Faces,&face);
      puVar1 = &((this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_pCurrentMesh->m_uiNumIndices;
      *puVar1 = *puVar1 + (int)((ulong)((long)(face->m_vertices).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(face->m_vertices).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      puVar1 = ((this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
               m_pCurrentMesh->m_uiUVCoordinates;
      *puVar1 = *puVar1 + (int)((ulong)((long)(face->m_texturCoords).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(face->m_texturCoords).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      pMVar11 = ((this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_pCurrentMesh;
      if (((~bVar3 | pMVar11->m_hasNormals) & 1) == 0) {
        pMVar11->m_hasNormals = true;
      }
      _Var5 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine)
      ;
      (this->m_DataIt)._M_current = _Var5._M_current;
    }
  }
  return;
}

Assistant:

void ObjFileParser::getFace( aiPrimitiveType type ) {
    m_DataIt = getNextToken<DataArrayIt>( m_DataIt, m_DataItEnd );
    if ( m_DataIt == m_DataItEnd || *m_DataIt == '\0' ) {
        return;
    }

    ObjFile::Face *face = new ObjFile::Face( type );
    bool hasNormal = false;

    const int vSize = static_cast<unsigned int>(m_pModel->m_Vertices.size());
    const int vtSize = static_cast<unsigned int>(m_pModel->m_TextureCoord.size());
    const int vnSize = static_cast<unsigned int>(m_pModel->m_Normals.size());

    const bool vt = (!m_pModel->m_TextureCoord.empty());
    const bool vn = (!m_pModel->m_Normals.empty());
    int iStep = 0, iPos = 0;
    while ( m_DataIt != m_DataItEnd ) {
        iStep = 1;

        if ( IsLineEnd( *m_DataIt ) ) {
            break;
        }

        if ( *m_DataIt =='/' ) {
            if (type == aiPrimitiveType_POINT) {
                ASSIMP_LOG_ERROR("Obj: Separator unexpected in point statement");
            }
            iPos++;
        } else if( IsSpaceOrNewLine( *m_DataIt ) ) {
            iPos = 0;
        } else {
            //OBJ USES 1 Base ARRAYS!!!!
            const int iVal( ::atoi( & ( *m_DataIt ) ) );

            // increment iStep position based off of the sign and # of digits
            int tmp = iVal;
            if ( iVal < 0 ) {
                ++iStep;
            }
            while ( ( tmp = tmp / 10 ) != 0 ) {
                ++iStep;
            }

            if (iPos == 1 && !vt && vn)
                iPos = 2; // skip texture coords for normals if there are no tex coords

            if ( iVal > 0 ) {
                // Store parsed index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( iVal - 1 );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( iVal - 1 );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( iVal - 1 );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else if ( iVal < 0 ) {
                // Store relatively index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( vSize + iVal );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( vtSize + iVal );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( vnSize + iVal );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else {
                //On error, std::atoi will return 0 which is not a valid value
                delete face;
                throw DeadlyImportError("OBJ: Invalid face indice");
            }

        }
        m_DataIt += iStep;
    }

    if ( face->m_vertices.empty() ) {
        ASSIMP_LOG_ERROR("Obj: Ignoring empty face");
        // skip line and clean up
        m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
        delete face;
        return;
    }

    // Set active material, if one set
    if( NULL != m_pModel->m_pCurrentMaterial ) {
        face->m_pMaterial = m_pModel->m_pCurrentMaterial;
    } else {
        face->m_pMaterial = m_pModel->m_pDefaultMaterial;
    }

    // Create a default object, if nothing is there
    if( NULL == m_pModel->m_pCurrent ) {
        createObject( DefaultObjName );
    }

    // Assign face to mesh
    if ( NULL == m_pModel->m_pCurrentMesh ) {
        createMesh( DefaultObjName );
    }

    // Store the face
    m_pModel->m_pCurrentMesh->m_Faces.push_back( face );
    m_pModel->m_pCurrentMesh->m_uiNumIndices += (unsigned int) face->m_vertices.size();
    m_pModel->m_pCurrentMesh->m_uiUVCoordinates[ 0 ] += (unsigned int) face->m_texturCoords.size();
    if( !m_pModel->m_pCurrentMesh->m_hasNormals && hasNormal ) {
        m_pModel->m_pCurrentMesh->m_hasNormals = true;
    }
    // Skip the rest of the line
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}